

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdphuff.c
# Opt level: O3

boolean decode_mcu_AC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_decoder *pjVar1;
  JBLOCKROW paJVar2;
  jpeg_error_mgr *pjVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  uchar *puVar14;
  int local_50;
  
  pjVar1 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    iVar11 = *(int *)((long)&pjVar1[3].start_pass + 4);
    if (iVar11 == 0) {
      process_restart(cinfo);
      iVar11 = *(int *)((long)&pjVar1[3].start_pass + 4);
    }
    *(int *)((long)&pjVar1[3].start_pass + 4) = iVar11 + -1;
  }
  if ((pjVar1[1].insufficient_data != -1) && (iVar11 = cinfo->Ss, iVar11 <= cinfo->Se)) {
    paJVar2 = *MCU_data;
    lVar7 = (long)cinfo->cur_comp_info[0]->ac_tbl_no;
    do {
      lVar8 = *(long *)(&pjVar1[8].insufficient_data + lVar7 * 2);
      lVar13 = (long)(iVar11 * 3 + -3);
      iVar4 = arith_decode(cinfo,(uchar *)(lVar8 + lVar13));
      if (iVar4 != 0) {
        return 1;
      }
      puVar14 = (uchar *)(lVar13 + lVar8 + 2);
      lVar8 = 0;
      while (iVar4 = arith_decode(cinfo,puVar14 + -1), iVar4 == 0) {
        puVar14 = puVar14 + 3;
        lVar8 = lVar8 + 1;
        if (cinfo->Se <= iVar11 + -1 + (int)lVar8) goto LAB_00135502;
      }
      iVar4 = arith_decode(cinfo,(uchar *)(pjVar1 + 0xe));
      iVar5 = arith_decode(cinfo,puVar14);
      local_50 = iVar11 + (int)lVar8;
      if (iVar5 == 0) {
        uVar12 = 0;
      }
      else {
        iVar5 = arith_decode(cinfo,puVar14);
        if (iVar5 == 0) {
          uVar12 = 1;
        }
        else {
          lVar13 = *(long *)(&pjVar1[8].insufficient_data + lVar7 * 2);
          lVar10 = 0xbd;
          if ((int)(uint)cinfo->arith_ac_K[lVar7] < local_50) {
            lVar10 = 0xd9;
          }
          puVar14 = (uchar *)(lVar13 + lVar10);
          iVar5 = arith_decode(cinfo,puVar14);
          if (iVar5 == 0) {
            puVar14 = puVar14 + 0xe;
            uVar12 = 2;
            uVar9 = uVar12;
          }
          else {
            puVar14 = (uchar *)(lVar13 + lVar10 + 0xe);
            uVar12 = 2;
            do {
              uVar12 = uVar12 * 2;
              if (uVar12 == 0x8000) {
LAB_00135502:
                pjVar3 = cinfo->err;
                pjVar3->msg_code = 0x7e;
                (*pjVar3->emit_message)((j_common_ptr)cinfo,-1);
                pjVar1[1].insufficient_data = -1;
                return 1;
              }
              iVar5 = arith_decode(cinfo,puVar14 + -0xd);
              puVar14 = puVar14 + 1;
            } while (iVar5 != 0);
            uVar9 = uVar12;
            if (uVar12 == 0) {
              uVar12 = 0;
              goto LAB_001354af;
            }
          }
          do {
            uVar9 = (int)uVar9 >> 1;
            uVar6 = arith_decode(cinfo,puVar14);
            if (uVar6 != 0) {
              uVar6 = uVar9;
            }
            uVar12 = uVar12 | uVar6;
          } while (1 < uVar9);
        }
      }
LAB_001354af:
      uVar9 = ~uVar12;
      if (iVar4 == 0) {
        uVar9 = uVar12 + 1;
      }
      (*paJVar2)[jpeg_natural_order[iVar11 + lVar8]] = (JCOEF)(uVar9 << ((byte)cinfo->Al & 0x1f));
      iVar11 = iVar11 + (int)lVar8 + 1;
    } while (local_50 < cinfo->Se);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_first(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  int Se = cinfo->Se;
  int Al = cinfo->Al;
  register int s, k, r;
  unsigned int EOBRUN;
  JBLOCKROW block;
  BITREAD_STATE_VARS;
  d_derived_tbl *tbl;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (!process_restart(cinfo))
        return FALSE;
  }

  /* If we've run out of data, just leave the MCU set to zeroes.
   * This way, we return uniform gray for the remainder of the segment.
   */
  if (!entropy->pub.insufficient_data) {

    /* Load up working state.
     * We can avoid loading/saving bitread state if in an EOB run.
     */
    EOBRUN = entropy->saved.EOBRUN;     /* only part of saved state we need */

    /* There is always only one block per MCU */

    if (EOBRUN > 0)             /* if it's a band of zeroes... */
      EOBRUN--;                 /* ...process it now (we do nothing) */
    else {
      BITREAD_LOAD_STATE(cinfo, entropy->bitstate);
      block = MCU_data[0];
      tbl = entropy->ac_derived_tbl;

      for (k = cinfo->Ss; k <= Se; k++) {
        HUFF_DECODE(s, br_state, tbl, return FALSE, label2);
        r = s >> 4;
        s &= 15;
        if (s) {
          k += r;
          CHECK_BIT_BUFFER(br_state, s, return FALSE);
          r = GET_BITS(s);
          s = HUFF_EXTEND(r, s);
          /* Scale and output coefficient in natural (dezigzagged) order */
          (*block)[jpeg_natural_order[k]] = (JCOEF)LEFT_SHIFT(s, Al);
        } else {
          if (r == 15) {        /* ZRL */
            k += 15;            /* skip 15 zeroes in band */
          } else {              /* EOBr, run length is 2^r + appended bits */
            EOBRUN = 1 << r;
            if (r) {            /* EOBr, r > 0 */
              CHECK_BIT_BUFFER(br_state, r, return FALSE);
              r = GET_BITS(r);
              EOBRUN += r;
            }
            EOBRUN--;           /* this band is processed at this moment */
            break;              /* force end-of-band */
          }
        }
      }

      BITREAD_SAVE_STATE(cinfo, entropy->bitstate);
    }

    /* Completed MCU, so update state */
    entropy->saved.EOBRUN = EOBRUN;     /* only part of saved state we need */
  }

  /* Account for restart interval (no-op if not using restarts) */
  if (cinfo->restart_interval)
    entropy->restarts_to_go--;

  return TRUE;
}